

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void ngai_puts(char *loc_base_ptr,char *pbuf,int *stride_loc,char *prem,int *stride_rem,int *count,
              int nstrides,int proc,int field_off,int field_size,int type_size)

{
  void *pvVar1;
  long in_RDX;
  void *in_RDI;
  int *in_R9;
  int in_stack_00000008;
  int in_stack_00000020;
  int in_stack_00000028;
  int i;
  int in_stack_ffffffffffffff9c;
  int *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  int local_34;
  int *src_stride_arr;
  
  if ((in_stack_00000020 < 0) || (in_stack_00000020 == in_stack_00000028)) {
    ARMCI_PutS(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
               (int)in_R9);
  }
  else {
    src_stride_arr = in_R9 + -1;
    pvVar1 = (void *)(in_RDX + -4);
    for (local_34 = 1; local_34 < in_stack_00000008 + 1; local_34 = local_34 + 1) {
      *(int *)((long)pvVar1 + (long)local_34 * 4) =
           *(int *)((long)pvVar1 + (long)local_34 * 4) / in_stack_00000028;
      *(int *)((long)pvVar1 + (long)local_34 * 4) =
           in_stack_00000020 * *(int *)((long)pvVar1 + (long)local_34 * 4);
      in_stack_ffffffffffffffc0 = pvVar1;
    }
    *in_R9 = *in_R9 / in_stack_00000028;
    ARMCI_PutS(in_stack_ffffffffffffffc0,src_stride_arr,in_RDI,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(int)src_stride_arr);
    src_stride_arr[1] = in_stack_00000028 * src_stride_arr[1];
    for (local_34 = 1; local_34 < in_stack_00000008 + 1; local_34 = local_34 + 1) {
      *(int *)((long)pvVar1 + (long)local_34 * 4) =
           *(int *)((long)pvVar1 + (long)local_34 * 4) / in_stack_00000020;
      *(int *)((long)pvVar1 + (long)local_34 * 4) =
           in_stack_00000028 * *(int *)((long)pvVar1 + (long)local_34 * 4);
    }
  }
  return;
}

Assistant:

static void ngai_puts(char *loc_base_ptr, char *pbuf, int *stride_loc, char *prem, int *stride_rem,
		      int *count, int nstrides, int proc, int field_off, 
		      int field_size, int type_size) {
  if(field_size<0 || field_size == type_size) {
    ARMCI_PutS(pbuf,stride_loc,prem,stride_rem,count,nstrides,proc);
  }
  else {
    int i;
    count -= 1;
    stride_loc -= 1;
    stride_rem -= 1;
    nstrides += 1;

    for(i=1; i<nstrides; i++) {
      stride_loc[i] /= type_size;
      stride_loc[i] *= field_size;
    }

    pbuf = loc_base_ptr + (pbuf - loc_base_ptr)/type_size*field_size;
    prem += field_off;

    count[1] /= type_size; 
    ARMCI_PutS(pbuf,stride_loc,prem,stride_rem,count,nstrides,proc);
    count[1] *= type_size; /*restore*/
    for(i=1; i<nstrides; i++) {
      stride_loc[i] /= field_size;
      stride_loc[i] *= type_size;
    }
  }
}